

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O1

void __thiscall wasm::ReorderGlobals::run(ReorderGlobals *this,Module *module)

{
  pointer puVar1;
  __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
  __first;
  __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
  __last;
  long lVar2;
  __node_base _Var3;
  mapped_type *pmVar4;
  ulong uVar5;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar6;
  undefined1 local_258 [8];
  UseCountScanner scanner;
  NameCountMap *local_140;
  long local_138;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_130;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8;
  undefined1 local_b0 [8];
  NameCountMap counts;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  sortedIndexes;
  Name global_1;
  
  puVar6 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((0x3ff < (ulong)((long)puVar1 - (long)puVar6)) || (this->always == true)) {
    local_b0 = (undefined1  [8])&counts._M_h._M_rehash_policy._M_next_resize;
    counts._M_h._M_buckets = (__buckets_ptr)0x1;
    counts._M_h._M_bucket_count = 0;
    counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    counts._M_h._M_element_count._0_4_ = 0x3f800000;
    counts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    counts._M_h._M_rehash_policy._4_4_ = 0;
    counts._M_h._M_rehash_policy._M_next_resize = 0;
    if (puVar6 != puVar1) {
      do {
        std::__detail::
        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)local_b0,
                     (key_type *)
                     (puVar6->_M_t).
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar1);
    }
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass.runner =
         (PassRunner *)
         &scanner.
          super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
          .super_Pass.name._M_string_length;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass._vptr_Pass = (_func_int **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass.name._M_string_length._0_1_ = 0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass.name.field_2._8_8_ = 0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.replacep =
         (Expression **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.fixed.
    _M_elems[9].currp = (Expression **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.currFunction =
         (Function *)0x0;
    local_258 = (undefined1  [8])&PTR__WalkerPass_00d8ab00;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.currModule =
         (Module *)local_b0;
    WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
           *)local_258,(this->super_Pass).runner,module);
    WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                       *)local_258,(this->super_Pass).runner,module);
    counts._M_h._M_single_bucket =
         (__node_base_ptr)&sortedIndexes._M_h._M_rehash_policy._M_next_resize;
    sortedIndexes._M_h._M_buckets = (__buckets_ptr)0x1;
    sortedIndexes._M_h._M_bucket_count = 0;
    sortedIndexes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    sortedIndexes._M_h._M_element_count._0_4_ = 0x3f800000;
    sortedIndexes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    sortedIndexes._M_h._M_rehash_policy._4_4_ = 0;
    sortedIndexes._M_h._M_rehash_policy._M_next_resize = 0;
    run(wasm::Module*)::DependencySort::DependencySort(wasm::Module&,std::unordered_map<wasm::
    Name,std::atomic<unsigned_int>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
    allocator<std::pair<wasm::Name_const,std::atomic<unsigned_int>_>_>_>_const__
              (&scanner.counts,module,(NameCountMap *)local_b0);
    TopologicalSort<wasm::Name,_DependencySort>::stepToNext
              ((TopologicalSort<wasm::Name,_DependencySort> *)&scanner.counts);
    while (_Var3._M_nxt = sortedIndexes._M_h._M_before_begin._M_nxt, scanner.counts != local_140) {
      sortedIndexes._M_h._M_single_bucket =
           (__node_base_ptr)local_140[-1]._M_h._M_rehash_policy._M_next_resize;
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&counts._M_h._M_single_bucket,
                            (key_type *)&sortedIndexes._M_h._M_single_bucket);
      *pmVar4 = (mapped_type)_Var3._M_nxt;
      TopologicalSort<wasm::Name,_DependencySort>::finishCurr
                ((TopologicalSort<wasm::Name,_DependencySort> *)&scanner.counts);
      TopologicalSort<wasm::Name,_DependencySort>::stepToNext
                ((TopologicalSort<wasm::Name,_DependencySort> *)&scanner.counts);
    }
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_e8);
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_130);
    if (scanner.counts != (NameCountMap *)0x0) {
      operator_delete(scanner.counts,local_138 - (long)scanner.counts);
    }
    __first._M_current =
         (module->globals).
         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (module->globals).
         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar5 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>*,std::vector<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>,std::allocator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ReorderGlobals::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>const&,std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>const&)_1_>>
                (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_ReorderGlobals_cpp:152:7)>
                  )&counts._M_h._M_single_bucket);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>*,std::vector<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>,std::allocator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ReorderGlobals::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>const&,std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>const&)_1_>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_ReorderGlobals_cpp:152:7)>
                  )&counts._M_h._M_single_bucket);
    }
    Module::updateMaps(module);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&counts._M_h._M_single_bucket);
    if (scanner.
        super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
        .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
        super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.fixed
        ._M_elems[9].currp != (Expression **)0x0) {
      operator_delete(scanner.
                      super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                      .
                      super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>
                      .
                      super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>
                      .stack.fixed._M_elems[9].currp,
                      (long)scanner.
                            super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                            .
                            super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>
                            .
                            super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)scanner.
                            super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                            .
                            super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>
                            .
                            super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>
                            .stack.fixed._M_elems[9].currp);
    }
    local_258 = (undefined1  [8])&PTR__Pass_00d87048;
    if (scanner.
        super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
        .super_Pass.runner !=
        (PassRunner *)
        &scanner.
         super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
         .super_Pass.name._M_string_length) {
      operator_delete(scanner.
                      super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                      .super_Pass.runner,
                      CONCAT71(scanner.
                               super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                               .super_Pass.name._M_string_length._1_7_,
                               (undefined1)
                               scanner.
                               super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                               .super_Pass.name._M_string_length) + 1);
    }
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_b0);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (module->globals.size() < 128 && !always) {
      // The module has so few globals that they all fit in a single-byte U32LEB
      // value, so no reordering we can do can actually decrease code size. Note
      // that this is the common case with wasm MVP modules where the only
      // globals are typically the stack pointer and perhaps a handful of others
      // (however, features like wasm GC there may be a great many globals).
      return;
    }

    NameCountMap counts;
    // Fill in info, as we'll operate on it in parallel.
    for (auto& global : module->globals) {
      counts[global->name];
    }

    // Count uses.
    UseCountScanner scanner(counts);
    scanner.run(getPassRunner(), module);
    scanner.runOnModuleCode(getPassRunner(), module);

    // Do a toplogical sort to ensure we keep dependencies before the things
    // that need them. For example, if $b's definition depends on $a then $b
    // must appear later:
    //
    //   (global $a i32 (i32.const 10))
    //   (global $b i32 (global.get $a)) ;; $b depends on $a
    //
    struct DependencySort : TopologicalSort<Name, DependencySort> {
      Module& wasm;
      const NameCountMap& counts;

      std::unordered_map<Name, std::vector<Name>> deps;

      DependencySort(Module& wasm, const NameCountMap& counts)
        : wasm(wasm), counts(counts) {
        // Sort a list of global names by their counts.
        auto sort = [&](std::vector<Name>& globals) {
          std::stable_sort(
            globals.begin(), globals.end(), [&](const Name& a, const Name& b) {
              return counts.at(a) < counts.at(b);
            });
        };

        // Sort the globals.
        std::vector<Name> sortedNames;
        for (auto& global : wasm.globals) {
          sortedNames.push_back(global->name);
        }
        sort(sortedNames);

        // Everything is a root (we need to emit all globals).
        for (auto global : sortedNames) {
          push(global);
        }

        // The dependencies are the globals referred to.
        for (auto& global : wasm.globals) {
          if (global->imported()) {
            continue;
          }
          std::vector<Name> vec;
          for (auto* get : FindAll<GlobalGet>(global->init).list) {
            vec.push_back(get->name);
          }
          sort(vec);
          deps[global->name] = std::move(vec);
        }
      }

      void pushPredecessors(Name global) {
        for (auto pred : deps[global]) {
          push(pred);
        }
      }
    };

    std::unordered_map<Name, Index> sortedIndexes;
    for (auto global : DependencySort(*module, counts)) {
      auto index = sortedIndexes.size();
      sortedIndexes[global] = index;
    }

    std::sort(
      module->globals.begin(),
      module->globals.end(),
      [&](const std::unique_ptr<Global>& a, const std::unique_ptr<Global>& b) {
        return sortedIndexes[a->name] < sortedIndexes[b->name];
      });

    module->updateMaps();
  }